

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  char cVar2;
  int __fd;
  char *__src;
  int *piVar3;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int port;
  timeval now_time;
  int local_54;
  long *local_50 [2];
  long local_40 [2];
  timeval local_30;
  
  local_54 = 0;
  CLogger::SetLevel(0x14c328);
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  _current_time = local_30.tv_sec;
  __src = ctime((time_t *)&current_time);
  strcpy(&str_boot_time,__src);
  _fpReserve = fopen("/dev/null","r");
  if (_fpReserve == (FILE *)0x0) {
    piVar3 = __errno_location();
    local_50[0] = (long *)strerror(*piVar3);
    fmt._M_str = "Main: fopen {}: {}";
    fmt._M_len = 0x12;
    CLogger::Error<char_const(&)[10],char*>
              ((CLogger *)0x14c328,fmt,(char (*) [10])"/dev/null",(char **)local_50);
  }
  else {
    Config::GetValue_abi_cxx11_((char *)local_50);
    plVar1 = local_50[0];
    local_54 = atoi((char *)local_50[0]);
    if (plVar1 != local_40) {
      operator_delete(plVar1,local_40[0] + 1);
    }
    if (1 < argc) {
      cVar2 = is_number(argv[1]);
      if (cVar2 == '\0') {
        fprintf(_stderr,"Usage: %s [port #]\n",*argv);
        goto LAB_00121bde;
      }
      local_54 = atoi(argv[1]);
      if (local_54 == 0x29a) {
        CLogger::SetLevel(0x14c328);
        bDebug = 1;
      }
      else if (local_54 < 0x401) {
        fwrite("Port number must be above 1024.\n",0x20,1,_stderr);
        goto LAB_00121bde;
      }
    }
    _mPort = local_54;
    __fd = init_socket(local_54);
    cVar2 = CMud::Bootup();
    if (cVar2 == '\0') {
      fmt_02._M_str = "Riftshadow failed to boot, aborting.";
      fmt_02._M_len = 0x24;
      CLogger::Error<>((CLogger *)0x14c328,fmt_02);
    }
    else {
      fmt_00._M_str = "Riftshadow booted, binding on port {}.";
      fmt_00._M_len = 0x26;
      CLogger::Info<int&>((CLogger *)0x14c328,fmt_00,&local_54);
      game_loop_unix(__fd);
      close(__fd);
      fmt_01._M_str = "Normal termination of game.";
      fmt_01._M_len = 0x1b;
      CLogger::Info<>((CLogger *)0x14c328,fmt_01);
    }
  }
LAB_00121bde:
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	struct timeval now_time;
	int port = 0;
	int control;

	RS.Logger.SetLevel(spdlog::level::info);

	/*
	 * Memory debugging if needed.
	 */
#ifdef MALLOC_DEBUG
	malloc_debug(2);
#endif

	/*
	 * Init time.
	 */
	gettimeofday(&now_time, nullptr);
	current_time = (time_t)now_time.tv_sec;
	strcpy(str_boot_time, ctime(&current_time));

	/*
	 * Reserve one channel for our use.
	 */
	if ((fpReserve = fopen(NULL_FILE, "r")) == nullptr)
	{
		RS.Logger.Error("Main: fopen {}: {}", NULL_FILE, std::strerror(errno));
		exit(0);
	}

	/*
	 * Get the port number.
	 */
	port = atoi(RS.SQL.Settings.GetValue("Port").c_str());
	if (argc > 1)
	{
		if (!is_number(argv[1]))
		{
			fprintf(stderr, "Usage: %s [port #]\n", argv[0]);
			exit(0);
		}
		else if ((port = atoi(argv[1])) == 666)
		{
			RS.Logger.SetLevel(spdlog::level::debug);
			bDebug = true;
		}
		else if (port <= 1024)
		{
			fprintf(stderr, "Port number must be above 1024.\n");
			exit(0);
		}
	}

	mPort = port;

	/*
	 * Run the game.
	 */
	control = init_socket(port);

	// boot_db( );
	if (!RS.Bootup())
	{
		RS.Logger.Error("Riftshadow failed to boot, aborting.");
		exit(0);
		return 0;
	}

	RS.Logger.Info("Riftshadow booted, binding on port {}.", port);

	game_loop_unix(control);
	close(control);

	/*
	 * That's all, folks.
	 */
	RS.Logger.Info("Normal termination of game.");
	exit(0);
	return 0;
}